

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctkern__pass_filter(fctkern_t *nk,char *test_name)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *prefix_00;
  int pass;
  char *prefix;
  size_t prefix_list_size;
  size_t prefix_i;
  char *test_name_local;
  fctkern_t *nk_local;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != ((void*)0) && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8b9
                  ,"int fctkern__pass_filter(fctkern_t *, const char *)");
  }
  if (test_name != (char *)0x0) {
    sVar2 = strlen(test_name);
    if (sVar2 == 0) {
      __assert_fail("strlen(test_name) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x8bb,"int fctkern__pass_filter(fctkern_t *, const char *)");
    }
    sVar3 = fct_nlist__size(&nk->prefix_list);
    if (sVar3 == 0) {
      nk_local._4_4_ = 1;
    }
    else {
      for (prefix_list_size = 0; prefix_list_size != sVar3; prefix_list_size = prefix_list_size + 1)
      {
        prefix_00 = (char *)fct_nlist__at(&nk->prefix_list,prefix_list_size);
        iVar1 = fct_filter_pass(prefix_00,test_name);
        if (iVar1 != 0) {
          return 1;
        }
      }
      nk_local._4_4_ = 0;
    }
    return nk_local._4_4_;
  }
  __assert_fail("test_name != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x8ba,
                "int fctkern__pass_filter(fctkern_t *, const char *)");
}

Assistant:

static nbool_t
fctkern__pass_filter(fctkern_t *nk, char const *test_name)
{
    size_t prefix_i =0;
    size_t prefix_list_size =0;
    FCT_ASSERT( nk != NULL && "invalid arg");
    FCT_ASSERT( test_name != NULL );
    FCT_ASSERT( strlen(test_name) > 0 );
    prefix_list_size = fctkern__filter_cnt(nk);
    /* If there is no filter list, then we return FCT_TRUE always. */
    if ( prefix_list_size == 0 )
    {
        return FCT_TRUE;
    }
    /* Iterate through the prefix filter list, and see if we have
    anything that does not pass. All we require is ONE item that
    passes the test in order for us to succeed here. */
    for ( prefix_i = 0; prefix_i != prefix_list_size; ++prefix_i )
    {
        char const *prefix = (char const*)fct_nlist__at(
                                 &(nk->prefix_list), prefix_i
                             );
        nbool_t pass = fct_filter_pass(prefix, test_name);
        if ( pass )
        {
            return FCT_TRUE;
        }
    }
    /* Otherwise, we never managed to find a prefix that satisfied the
    supplied test name. Therefore we have failed to pass to the filter
    list test. */
    return FCT_FALSE;
}